

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O1

zt_ptr_array * zt_cstr_split(char *str,char *delim)

{
  int iVar1;
  zt_ptr_array *array;
  char *__s;
  char *pcVar2;
  char *endptr;
  char *local_28;
  
  if (delim == (char *)0x0 || str == (char *)0x0) {
    array = (zt_ptr_array *)0x0;
  }
  else {
    array = zt_ptr_array_init((void *)0x0,free);
    local_28 = (char *)0x0;
    __s = strdup(str);
    pcVar2 = strtok_r(__s,delim,&local_28);
    while (pcVar2 != (char *)0x0) {
      pcVar2 = strdup(pcVar2);
      iVar1 = zt_ptr_array_add(array,pcVar2);
      if (iVar1 < 0) {
        zt_ptr_array_free(array,1);
        array = (zt_ptr_array *)0x0;
        break;
      }
      pcVar2 = strtok_r((char *)0x0,delim,&local_28);
    }
    free(__s);
  }
  return array;
}

Assistant:

zt_ptr_array *
zt_cstr_split(const char *str, const char *delim) {
    char         *str_copy;
    char         *endptr;
    char         *tok;
    zt_ptr_array *split_array;

    if (str == NULL || delim == NULL) {
        return NULL;
    }

    split_array = zt_ptr_array_init(NULL, (zt_ptr_array_free_cb)free);

    endptr      = NULL;

    str_copy    = strdup(str);

    for (tok = strtok_r(str_copy, delim, &endptr); tok != NULL; tok = strtok_r(NULL, delim, &endptr)) {
        if (zt_ptr_array_add(split_array, (void *)strdup(tok)) < 0) {
            zt_ptr_array_free(split_array, 1);
            free(str_copy);
            return NULL;
        }
    }

    free(str_copy);

    return split_array;
}